

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandVoid
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  long lVar1;
  allocator<char> local_51;
  size_t local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  
  local_50 = initialSkipCount;
  determineReturnParams(&returnParams,this,&commandData->params);
  lVar1 = (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (lVar1 == 2) {
    generateCommandVoid2Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,&returnParams,raii);
  }
  else if (lVar1 == 1) {
    generateCommandVoid1Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,
               *returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start,raii);
  }
  else if (lVar1 == 0) {
    generateCommandVoid0Return
              (__return_storage_ptr__,this,name,commandData,local_50,definition,raii);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_51);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandVoid(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  std::vector<size_t> returnParams = determineReturnParams( commandData.params );
  switch ( returnParams.size() )
  {
    case 0 : return generateCommandVoid0Return( name, commandData, initialSkipCount, definition, raii );
    case 1 : return generateCommandVoid1Return( name, commandData, initialSkipCount, definition, returnParams[0], raii );
    case 2 : return generateCommandVoid2Return( name, commandData, initialSkipCount, definition, returnParams, raii );
    default: break;
  }
  return "";
}